

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::btToPos(SAT *this,int sat_pos,int core_pos)

{
  vec<Lit> *pvVar1;
  vec<Lit> *pvVar2;
  lbool lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar2 = (this->trail).data;
  uVar4 = (this->trail).sz - 1;
  pvVar1 = pvVar2 + uVar4;
  uVar4 = pvVar2[uVar4].sz;
  uVar6 = (ulong)uVar4;
  if (sat_pos < (int)uVar4) {
    lVar3.value = ::l_Undef.value;
    do {
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
      uVar4 = pvVar1->data[uVar6].x >> 1;
      (this->assigns).data[uVar4] = lVar3.value;
      if ((((int)(this->order_heap).indices.sz <= (int)uVar4) ||
          ((this->order_heap).indices.data[uVar4] < 0)) &&
         (((uint)(this->flags).data[uVar4] & 1) != 0)) {
        Heap<SAT::VarOrderLt>::insert(&this->order_heap,uVar4);
        lVar3 = ::l_Undef;
      }
    } while (sat_pos < (int)uVar5);
  }
  pvVar1->sz = sat_pos;
  Engine::btToPos(&engine,core_pos);
  return;
}

Assistant:

void SAT::btToPos(int sat_pos, int core_pos) {
	untrailToPos(trail.last(), sat_pos);
	engine.btToPos(core_pos);
}